

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O2

Image * Image_Function_Helper::AbsoluteDifference
                  (Image *__return_storage_ptr__,AbsoluteDifferenceForm4 absoluteDifference,
                  Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
                  uint32_t startY2,uint32_t width,uint32_t height)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in1,startX1,startY1,in2,startX2,startY2,width,height);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,in1,width,height,in1->_colorCount,'\x01');
  (*absoluteDifference)
            (in1,startX1,startY1,in2,startX2,startY2,__return_storage_ptr__,0,0,
             __return_storage_ptr__->_width,__return_storage_ptr__->_height);
  return __return_storage_ptr__;
}

Assistant:

Image AbsoluteDifference( FunctionTable::AbsoluteDifferenceForm4 absoluteDifference,
                              const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                              uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, width, height );

        Image out = in1.generate( width, height, in1.colorCount() );

        absoluteDifference( in1, startX1, startY1, in2, startX2, startY2, out, 0, 0, out.width(), out.height() );

        return out;
    }